

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O2

Error asmjit::v1_14::VirtMem::protect(void *p,size_t size,MemoryFlags memoryFlags)

{
  int iVar1;
  Error EVar2;
  int *piVar3;
  
  iVar1 = mmProtFromMemoryFlags(memoryFlags);
  iVar1 = mprotect(p,size,iVar1);
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    EVar2 = asmjitErrorFromErrno(*piVar3);
    return EVar2;
  }
  return 0;
}

Assistant:

Error protect(void* p, size_t size, MemoryFlags memoryFlags) noexcept {
  int protection = mmProtFromMemoryFlags(memoryFlags);
  if (mprotect(p, size, protection) == 0)
    return kErrorOk;

  return DebugUtils::errored(asmjitErrorFromErrno(errno));
}